

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::AssignmentExpression::fromComponents
          (Compilation *compilation,optional<slang::ast::BinaryOperator> op,
          bitmask<slang::ast::AssignFlags> flags,Expression *lhs,Expression *rhs,SourceRange opRange
          ,TimingControl *timingControl,SourceRange sourceRange,ASTContext *context)

{
  bool bVar1;
  AssignmentExpression *expr;
  Expression *pEVar2;
  Type *type;
  Symbol *pSVar3;
  DiagCode code;
  ASTContext *context_00;
  SourceRange SVar4;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  SourceLocation args_6;
  bitmask<slang::ast::AssignFlags> flags_local;
  bool local_49;
  SourceLocation local_48;
  TimingControl *timingControl_local;
  optional<slang::ast::BinaryOperator> op_local;
  
  args_6 = (SourceLocation)&sourceRange;
  local_49 = (bool)(flags.m_bits & 1);
  context_00 = (ASTContext *)rhs;
  flags_local = flags;
  timingControl_local = timingControl;
  op_local = op;
  expr = BumpAllocator::
         emplace<slang::ast::AssignmentExpression,std::optional<slang::ast::BinaryOperator>&,bool,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::TimingControl_const*&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,&op_local,&local_49,(lhs->type).ptr,lhs,rhs,
                    &timingControl_local,(SourceRange *)args_6);
  bVar1 = Expression::bad(lhs);
  if ((!bVar1) && (bVar1 = Expression::bad(rhs), !bVar1)) {
    if (lhs->kind == Streaming) {
      assignmentRange_00.endLoc = (SourceLocation)context;
      assignmentRange_00.startLoc = opRange.endLoc;
      bVar1 = Bitstream::canBeTarget
                        ((Bitstream *)lhs,(StreamingConcatenationExpression *)rhs,
                         (Expression *)opRange.startLoc,assignmentRange_00,context_00);
      if ((bVar1) &&
         (bVar1 = Expression::requireLValue(lhs,context,opRange.startLoc,flags,(Expression *)0x0),
         bVar1)) {
        return &expr->super_Expression;
      }
    }
    else {
      if (op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::BinaryOperator>._M_engaged == false) {
        type = (Type *)expr->right_;
        local_48 = opRange.startLoc;
      }
      else {
        pEVar2 = &BumpAllocator::
                  emplace<slang::ast::LValueReferenceExpression,slang::ast::Type_const&,slang::SourceRange&>
                            (&compilation->super_BumpAllocator,(lhs->type).ptr,&lhs->sourceRange)->
                  super_Expression;
        local_48 = opRange.startLoc;
        SVar4.endLoc = sourceRange.endLoc;
        SVar4.startLoc = sourceRange.startLoc;
        args_6 = sourceRange.endLoc;
        type = (Type *)BinaryExpression::fromComponents
                                 (pEVar2,expr->right_,
                                  op_local.
                                  super__Optional_base<slang::ast::BinaryOperator,_true,_true>.
                                  _M_payload.
                                  super__Optional_payload_base<slang::ast::BinaryOperator>.
                                  _M_payload._M_value,opRange,SVar4,context);
        expr->right_ = (Expression *)type;
      }
      assignmentRange.endLoc = (SourceLocation)&expr->left_;
      assignmentRange.startLoc = opRange.endLoc;
      pEVar2 = Expression::convertAssignment
                         ((Expression *)context,(ASTContext *)(lhs->type).ptr,type,
                          (Expression *)local_48,assignmentRange,(Expression **)&flags_local,
                          (bitmask<slang::ast::AssignFlags> *)args_6);
      expr->right_ = pEVar2;
      bVar1 = Expression::bad(pEVar2);
      if ((!bVar1) &&
         (bVar1 = Expression::requireLValue
                            (expr->left_,context,local_48,flags_local,(Expression *)0x0), bVar1)) {
        if (timingControl_local == (TimingControl *)0x0) {
          return &expr->super_Expression;
        }
        pSVar3 = Expression::getSymbolReference(lhs,true);
        if ((pSVar3 == (Symbol *)0x0) || (pSVar3->kind != ClockVar)) {
          if (timingControl_local->kind != CycleDelay) {
            return &expr->super_Expression;
          }
          SVar4 = slang::syntax::SyntaxNode::sourceRange(timingControl_local->syntax);
          code.subsystem = Expressions;
          code.code = 0x48;
        }
        else {
          if (timingControl_local->kind == CycleDelay) {
            return &expr->super_Expression;
          }
          SVar4 = slang::syntax::SyntaxNode::sourceRange(timingControl_local->syntax);
          code.subsystem = Expressions;
          code.code = 0x3f;
        }
        ASTContext::addDiag(context,code,SVar4);
        return &expr->super_Expression;
      }
    }
  }
  pEVar2 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar2;
}

Assistant:

Expression& AssignmentExpression::fromComponents(
    Compilation& compilation, std::optional<BinaryOperator> op, bitmask<AssignFlags> flags,
    Expression& lhs, Expression& rhs, SourceRange opRange, const TimingControl* timingControl,
    SourceRange sourceRange, const ASTContext& context) {

    auto result = compilation.emplace<AssignmentExpression>(op, flags.has(AssignFlags::NonBlocking),
                                                            *lhs.type, lhs, rhs, timingControl,
                                                            sourceRange);

    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lhs.kind == ExpressionKind::Streaming) {
        if (!Bitstream::canBeTarget(lhs.as<StreamingConcatenationExpression>(), rhs, opRange,
                                    context)) {
            return badExpr(compilation, result);
        }

        if (!lhs.requireLValue(context, opRange.start(), flags))
            return badExpr(compilation, result);

        return *result;
    }

    // If this is a compound assignment operator create a binary expression that will
    // apply the operator for us on the right hand side.
    if (op) {
        auto lvalRef = compilation.emplace<LValueReferenceExpression>(*lhs.type, lhs.sourceRange);
        result->right_ = &BinaryExpression::fromComponents(*lvalRef, *result->right_, *op, opRange,
                                                           sourceRange, context);
    }

    result->right_ = &convertAssignment(context, *lhs.type, *result->right_, opRange,
                                        &result->left_, &flags);
    if (result->right_->bad())
        return badExpr(compilation, result);

    if (!result->left_->requireLValue(context, opRange.start(), flags))
        return badExpr(compilation, result);

    if (timingControl) {
        // Cycle delays are only allowed on clock vars, and clock vars
        // cannot use any timing control other than cycle delays.
        if (auto sym = lhs.getSymbolReference(); sym && sym->kind == SymbolKind::ClockVar) {
            if (timingControl->kind != TimingControlKind::CycleDelay) {
                SLANG_ASSERT(timingControl->syntax);
                context.addDiag(diag::ClockVarBadTiming, timingControl->syntax->sourceRange());
            }
        }
        else if (timingControl->kind == TimingControlKind::CycleDelay) {
            SLANG_ASSERT(timingControl->syntax);
            context.addDiag(diag::CycleDelayNonClock, timingControl->syntax->sourceRange());
        }
    }

    return *result;
}